

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_ExemptionDatabase.cpp
# Opt level: O2

ssize_t __thiscall
RenX::ExemptionDatabase::write(ExemptionDatabase *this,int __fd,void *__buf,size_t __n)

{
  int iVar1;
  FILE *__stream;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  __stream = fopen((this->m_filename)._M_dataplus._M_p,"r+b");
  iVar1 = fsetpos(__stream,(fpos_t *)&this->m_eof);
  if (__stream != (FILE *)0x0) {
    write(this,__fd,__stream,__n);
    iVar1 = fclose(__stream);
    return CONCAT44(extraout_var_00,iVar1);
  }
  return CONCAT44(extraout_var,iVar1);
}

Assistant:

void RenX::ExemptionDatabase::write(RenX::ExemptionDatabase::Entry *entry) {
	FILE *file = fopen(m_filename.c_str(), "r+b");
	fsetpos(file, std::addressof(m_eof));
	if (file != nullptr) {
		write(entry, file);
		fclose(file);
	}
}